

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

double __thiscall arangodb::velocypack::Parser::scanDigitsFractional(Parser *this)

{
  int iVar1;
  double dVar2;
  double local_18;
  
  local_18 = 0.0;
  dVar2 = 0.1;
  while( true ) {
    iVar1 = consume(this);
    if (iVar1 < 0) {
      return local_18;
    }
    if (iVar1 - 0x3aU < 0xfffffff6) break;
    local_18 = local_18 + (double)(iVar1 + -0x30) * dVar2;
    dVar2 = dVar2 / 10.0;
  }
  this->_pos = this->_pos - 1;
  return local_18;
}

Assistant:

double scanDigitsFractional() {
    double pot = 0.1;
    double x = 0.0;
    while (true) {
      int i = consume();
      if (i < 0) {
        return x;
      }
      if (i < '0' || i > '9') {
        unconsume();
        return x;
      }
      x = x + pot * (i - '0');
      pot /= 10.0;
    }
  }